

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest13NameConstraints_::
Section13ValidURInameConstraintsTest34<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
TestBody(Section13ValidURInameConstraintsTest34<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
         *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.13.34";
  local_88.should_validate = true;
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_3f4b62_006be080,(char *(*) [3])&PTR_anon_var_dwarf_3f4b94_006be150,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest13NameConstraints,
                     Section13ValidURInameConstraintsTest34) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "nameConstraintsURI1CACert",
                               "ValidURInameConstraintsTest34EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "nameConstraintsURI1CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.13.34";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}